

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
Cat<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *v1,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *v2)

{
  long lVar1;
  bool bVar2;
  size_type in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  uchar *arg;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1;
  iterator __end0;
  iterator __begin0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__lhs;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __lhs = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_stack_ffffffffffffff98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_stack_ffffffffffffff98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(in_RSI,in_RDX);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_RDI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_RDI);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)__lhs,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)in_RDI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator*((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)in_stack_ffffffffffffff98);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_stack_ffffffffffffff98,(value_type_conflict3 *)0x3ffd72);
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_ffffffffffffff98);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff98,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3ffd8d);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __lhs;
  }
  __stack_chk_fail();
}

Assistant:

inline V Cat(V v1, V&& v2)
{
    v1.reserve(v1.size() + v2.size());
    for (auto& arg : v2) {
        v1.push_back(std::move(arg));
    }
    return v1;
}